

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitBinaryOpnds(ParseNode *pnode1,ParseNode *pnode2,ByteCodeGenerator *byteCodeGenerator,
                    FuncInfo *funcInfo,RegSlot computedPropertyLocation)

{
  BOOL BVar1;
  
  BVar1 = MayHaveSideEffectOnNode(pnode1,pnode2,byteCodeGenerator);
  if (BVar1 != 0) {
    SaveOpndValue(pnode1,funcInfo);
  }
  Emit(pnode1,byteCodeGenerator,funcInfo,0,false,false);
  if ((computedPropertyLocation != 0xffffffff) && (pnode1->nop == knopComputedName)) {
    Js::ByteCodeWriter::Reg2
              (&byteCodeGenerator->m_writer,Conv_Prop,computedPropertyLocation,pnode1->location);
  }
  Emit(pnode2,byteCodeGenerator,funcInfo,0,false,computedPropertyLocation != 0);
  return;
}

Assistant:

void EmitBinaryOpnds(ParseNode* pnode1, ParseNode* pnode2, ByteCodeGenerator* byteCodeGenerator, FuncInfo* funcInfo, Js::RegSlot computedPropertyLocation)
{
    // If opnd2 can overwrite opnd1, make sure the value of opnd1 is stashed away.
    if (MayHaveSideEffectOnNode(pnode1, pnode2, byteCodeGenerator))
    {
        SaveOpndValue(pnode1, funcInfo);
    }

    Emit(pnode1, byteCodeGenerator, funcInfo, false);

    if (pnode1->nop == knopComputedName && computedPropertyLocation != Js::Constants::NoRegister)
    {
        byteCodeGenerator->Writer()->Reg2(Js::OpCode::Conv_Prop, computedPropertyLocation, pnode1->location);
    }

    Emit(pnode2, byteCodeGenerator, funcInfo, false, false, computedPropertyLocation);
}